

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O3

ps_latlink_t * ps_lattice_reverse_next(ps_lattice_t *dag,ps_latnode_t *start)

{
  anon_union_8_4_397b8dde_for_info *paVar1;
  ps_latnode_s *ppVar2;
  ps_latlink_t *ppVar3;
  ps_latlink_t *ppVar4;
  latlink_list_t *plVar5;
  
  ppVar3 = ps_lattice_popq(dag);
  if (ppVar3 != (ps_latlink_t *)0x0) {
    paVar1 = &ppVar3->from->info;
    paVar1->fanin = paVar1->fanin + -1;
    ppVar2 = ppVar3->from;
    if ((ppVar2->info).fanin == 0) {
      if (start == (ps_latnode_t *)0x0) {
        start = dag->start;
      }
      if (ppVar2 == start) {
        do {
          ppVar4 = ps_lattice_popq(dag);
        } while (ppVar4 != (ps_latlink_t *)0x0);
      }
      else {
        for (plVar5 = ppVar2->entries; plVar5 != (latlink_list_t *)0x0; plVar5 = plVar5->next) {
          ps_lattice_pushq(dag,plVar5->link);
        }
      }
    }
  }
  return ppVar3;
}

Assistant:

ps_latlink_t *
ps_lattice_reverse_next(ps_lattice_t *dag, ps_latnode_t *start)
{
    ps_latlink_t *next;

    next = ps_lattice_popq(dag);
    if (next == NULL)
        return NULL;

    /* Decrease fanout count for source node and expand incoming
     * edges if all incoming edges have been seen. */
    --next->from->info.fanin;
    if (next->from->info.fanin == 0) {
        latlink_list_t *x;

        if (start == NULL) start = dag->start;
        if (next->from == start) {
            /* If we have traversed all links entering the start node,
             * clear the queue, causing future calls to this function
             * to return NULL. */
            ps_lattice_delq(dag);
            return next;
        }

        /* Extend all outgoing edges. */
        for (x = next->from->entries; x; x = x->next)
            ps_lattice_pushq(dag, x->link);
    }
    return next;
}